

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O0

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
duckdb::SubqueryExpression::Deserialize(Deserializer *deserializer)

{
  Deserializer *this;
  Deserializer *this_00;
  pointer this_01;
  unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_> *in_RSI;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_> in_RDI;
  unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
  result;
  pointer in_stack_ffffffffffffff78;
  SubqueryExpression *in_stack_ffffffffffffff80;
  unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
  *in_stack_ffffffffffffff88;
  unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_> *puVar1;
  Deserializer *in_stack_ffffffffffffff90;
  field_id_t fVar2;
  
  operator_new(0x58);
  SubqueryExpression(in_stack_ffffffffffffff80);
  unique_ptr<duckdb::SubqueryExpression,std::default_delete<duckdb::SubqueryExpression>,true>::
  unique_ptr<std::default_delete<duckdb::SubqueryExpression>,void>
            ((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>::
  operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              *)in_stack_ffffffffffffff80);
  Deserializer::ReadProperty<duckdb::SubqueryType>
            (in_stack_ffffffffffffff90,(field_id_t)((ulong)in_stack_ffffffffffffff88 >> 0x30),
             (char *)in_stack_ffffffffffffff80,(SubqueryType *)in_stack_ffffffffffffff78);
  puVar1 = in_RSI;
  this = (Deserializer *)
         unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
         ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                       *)in_stack_ffffffffffffff80);
  fVar2 = (field_id_t)((ulong)puVar1 >> 0x30);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>>
            (this,fVar2,(char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  puVar1 = in_RSI;
  this_00 = (Deserializer *)
            unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                          *)in_stack_ffffffffffffff80);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (this,fVar2,(char *)this_00,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)puVar1);
  fVar2 = (field_id_t)((ulong)puVar1 >> 0x30);
  this_01 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
            ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                          *)in_stack_ffffffffffffff80);
  Deserializer::ReadProperty<duckdb::ExpressionType>
            (this_00,fVar2,(char *)this_01,(ExpressionType *)in_RSI);
  unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>::
  unique_ptr<duckdb::SubqueryExpression,std::default_delete<std::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>>>,void>
            ((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)this_01,in_RSI);
  unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>::
  ~unique_ptr((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
               *)0xadf7a8);
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (__uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         in_RDI._M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<ParsedExpression> SubqueryExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SubqueryExpression>(new SubqueryExpression());
	deserializer.ReadProperty<SubqueryType>(200, "subquery_type", result->subquery_type);
	deserializer.ReadPropertyWithDefault<unique_ptr<SelectStatement>>(201, "subquery", result->subquery);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(202, "child", result->child);
	deserializer.ReadProperty<ExpressionType>(203, "comparison_type", result->comparison_type);
	return std::move(result);
}